

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

int32 __thiscall nuraft::buffer::get_int(buffer *this)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  byte *pbVar3;
  buffer *in_RDI;
  int32 byte_val;
  size_t i;
  int32 val;
  byte *d;
  size_t avail;
  ulong local_38;
  int local_2c;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < 4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer available for an int32 value");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar3 = data(in_RDI);
  local_2c = 0;
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    local_2c = ((uint)pbVar3[local_38] << ((byte)(local_38 << 3) & 0x1f)) + local_2c;
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 4;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 4;
  }
  return local_2c;
}

Assistant:

int32 buffer::get_int() {
    size_t avail = size() - pos();
    if (avail < sz_int) {
        throw std::overflow_error
              ( "insufficient buffer available for an int32 value" );
    }

    byte* d = data();
    int32 val = 0;
    for (size_t i = 0; i < sz_int; ++i) {
        int32 byte_val = (int32)*(d + i);
        val += (byte_val << (i * 8));
    }

    __mv_fw_block(this, sz_int);
    return val;
}